

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus
getInstruction(MCInst *MI,uint8_t *code,size_t code_len,uint16_t *Size,uint64_t Address,
              MCRegisterInfo *MRI)

{
  uint32_t local_44;
  DecodeStatus result;
  uint32_t insn;
  MCRegisterInfo *MRI_local;
  uint64_t Address_local;
  uint16_t *Size_local;
  size_t code_len_local;
  uint8_t *code_local;
  MCInst *MI_local;
  
  if (code_len < 4) {
    *Size = 0;
    MI_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    if ((MI->csh->mode & CS_MODE_BIG_ENDIAN) == CS_MODE_ARM) {
      local_44 = (uint)code[3] << 0x18 | (uint)code[2] << 0x10 | (uint)code[1] << 8 | (uint)*code;
    }
    else {
      local_44 = (uint)*code << 0x18 | (uint)code[1] << 0x10 | (uint)code[2] << 8 | (uint)code[3];
    }
    if (MI->flat_insn->detail != (cs_detail *)0x0) {
      memset(MI->flat_insn->detail,0,0x5f8);
    }
    MI_local._4_4_ = decodeInstruction_4(DecoderTable32,MI,local_44,Address,4);
    if (MI_local._4_4_ == MCDisassembler_Fail) {
      MCInst_clear(MI);
      *Size = 0;
      MI_local._4_4_ = MCDisassembler_Fail;
    }
    else {
      *Size = 4;
    }
  }
  return MI_local._4_4_;
}

Assistant:

static DecodeStatus _getInstruction(cs_struct *ud, MCInst *MI,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, MCRegisterInfo *MRI)
{
	uint32_t insn;
	DecodeStatus result;
	size_t i;

	if (code_len < 4) {
		// not enough data
		*Size = 0;
		return MCDisassembler_Fail;
	}

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
		for (i = 0; i < ARR_SIZE(MI->flat_insn->detail->arm64.operands); i++)
			MI->flat_insn->detail->arm64.operands[i].vector_index = -1;
	}

	if (ud->big_endian)
		insn = (code[3] << 0) | (code[2] << 8) |
			(code[1] <<  16) | (code[0] <<  24);
	else
		insn = (code[3] << 24) | (code[2] << 16) |
			(code[1] <<  8) | (code[0] <<  0);

	// Calling the auto-generated decoder function.
	result = decodeInstruction(DecoderTable32, MI, insn, Address, MRI, 0);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	MCInst_clear(MI);
	*Size = 0;
	return MCDisassembler_Fail;
}